

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

int Abc_NtkDelayTraceCritPath_rec
              (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Abc_Obj_t *pLeaf,Vec_Int_t *vBest)

{
  Abc_Obj_t *pNode_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int Fill;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pFanin;
  long lVar6;
  float fVar7;
  float local_3c;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar2 != 2) {
    if (uVar2 == 7) {
      pVVar5 = &pNode->pNtk->vTravIds;
      iVar4 = pNode->Id;
      Vec_IntFillExtra(pVVar5,iVar4 + 1,(int)pLeaf);
      iVar3 = Vec_IntEntry(pVVar5,iVar4);
      iVar4 = pNode->pNtk->nTravIds;
      if (iVar3 == iVar4) {
        iVar4 = Vec_IntEntry(vBest,pNode->Id);
        bVar1 = -1 < iVar4;
      }
      else {
        pVVar5 = &pNode->pNtk->vTravIds;
        iVar3 = pNode->Id;
        Vec_IntFillExtra(pVVar5,iVar3 + 1,Fill);
        Vec_IntWriteEntry(pVVar5,iVar3,iVar4);
        if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                        ,0x34f,
                        "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                       );
        }
        local_3c = 1e+09;
        pFanin = (Abc_Obj_t *)0x0;
        for (lVar6 = 0; lVar6 < (pNode->vFanins).nSize; lVar6 = lVar6 + 1) {
          pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]];
          iVar4 = Abc_NtkDelayTraceCritPath_rec(vSlacks,pNode_00,pLeaf,vBest);
          if (iVar4 != 0) {
            if (pFanin != (Abc_Obj_t *)0x0) {
              fVar7 = Abc_NtkDelayTraceSlack(vSlacks,pNode,(int)lVar6);
              if (local_3c <= fVar7) goto LAB_002bf357;
            }
            local_3c = Abc_NtkDelayTraceSlack(vSlacks,pNode,(int)lVar6);
            pFanin = pNode_00;
          }
LAB_002bf357:
        }
        if (pFanin == (Abc_Obj_t *)0x0) {
          bVar1 = false;
        }
        else {
          iVar4 = pNode->Id;
          iVar3 = Abc_NodeFindFanin(pNode,pFanin);
          Vec_IntWriteEntry(vBest,iVar4,iVar3);
          bVar1 = true;
        }
      }
      goto LAB_002bf24b;
    }
    if (uVar2 != 5) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                    ,0x349,
                    "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                   );
    }
  }
  bVar1 = pLeaf == pNode || pLeaf == (Abc_Obj_t *)0x0;
LAB_002bf24b:
  return (int)bVar1;
}

Assistant:

int Abc_NtkDelayTraceCritPath_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Abc_Obj_t * pLeaf, Vec_Int_t * vBest )
{
    Abc_Obj_t * pFanin, * pFaninBest = NULL;
    float SlackMin = ABC_INFINITY;  int i;
    // check primary inputs
    if ( Abc_ObjIsCi(pNode) )
        return (pLeaf == NULL || pLeaf == pNode);
    assert( Abc_ObjIsNode(pNode) );
    // check visited
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return Vec_IntEntry(vBest, Abc_ObjId(pNode)) >= 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the node
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, pFanin, pLeaf, vBest ) )
            continue;
        if ( pFaninBest == NULL || SlackMin > Abc_NtkDelayTraceSlack(vSlacks, pNode, i) )
        {
            pFaninBest = pFanin;
            SlackMin = Abc_NtkDelayTraceSlack(vSlacks, pNode, i);
        }
    }
    if ( pFaninBest != NULL )
        Vec_IntWriteEntry( vBest, Abc_ObjId(pNode), Abc_NodeFindFanin(pNode, pFaninBest) );
    return (pFaninBest != NULL);
}